

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O2

void avro::testStreamLifetimes(void)

{
  auto_ptr<avro::OutputStream> s1;
  EncoderPtr e;
  
  avro::binaryEncoder();
  avro::memoryOutputStream((ulong)&s1);
  (**(code **)(*(long *)e.px + 0x10))(e.px,s1._M_ptr);
  (**(code **)(*(long *)e.px + 0x30))(e.px,100);
  (**(code **)(*(long *)e.px + 0x48))(0x4012eb851eb851ec);
  (**(code **)(*(long *)e.px + 0x18))();
  if (s1._M_ptr != (OutputStream *)0x0) {
    (**(code **)(*(long *)s1._M_ptr + 8))();
  }
  avro::memoryOutputStream((ulong)&s1);
  (**(code **)(*(long *)e.px + 0x10))(e.px,s1._M_ptr);
  (**(code **)(*(long *)e.px + 0x48))(0x40091eb851eb851f);
  (**(code **)(*(long *)e.px + 0x18))();
  if (s1._M_ptr != (OutputStream *)0x0) {
    (**(code **)(*(long *)s1._M_ptr + 8))();
  }
  boost::detail::shared_count::~shared_count(&e.pn);
  return;
}

Assistant:

static void testStreamLifetimes()
{
    EncoderPtr e = binaryEncoder();
    {
        std::auto_ptr<OutputStream> s1 = memoryOutputStream();
        e->init(*s1);
        e->encodeInt(100);
        e->encodeDouble(4.73);
        e->flush();
    }

    {
        std::auto_ptr<OutputStream> s2 = memoryOutputStream();
        e->init(*s2);
        e->encodeDouble(3.14);
        e->flush();
    }

}